

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_row_layout(nk_context *ctx,nk_layout_format fmt,float height,int cols,int width)

{
  long lVar1;
  int in_ECX;
  int in_ESI;
  long in_RDI;
  nk_window *win;
  int in_stack_00000030;
  float in_stack_00000034;
  nk_window *in_stack_00000038;
  nk_context *in_stack_00000040;
  
  if (((in_RDI != 0) && (*(long *)(in_RDI + 0x3fc8) != 0)) &&
     (*(long *)(*(long *)(in_RDI + 0x3fc8) + 0xa0) != 0)) {
    lVar1 = *(long *)(in_RDI + 0x3fc8);
    nk_panel_layout(in_stack_00000040,in_stack_00000038,in_stack_00000034,in_stack_00000030);
    if (in_ESI == 0) {
      *(undefined4 *)(*(long *)(lVar1 + 0xa0) + 0x60) = 0;
    }
    else {
      *(undefined4 *)(*(long *)(lVar1 + 0xa0) + 0x60) = 4;
    }
    *(undefined8 *)(*(long *)(lVar1 + 0xa0) + 0x70) = 0;
    *(undefined4 *)(*(long *)(lVar1 + 0xa0) + 0x84) = 0;
    *(undefined4 *)(*(long *)(lVar1 + 0xa0) + 0x80) = 0;
    *(float *)(*(long *)(lVar1 + 0xa0) + 0x78) = (float)in_ECX;
  }
  return;
}

Assistant:

NK_INTERN void
nk_row_layout(struct nk_context *ctx, enum nk_layout_format fmt,
    float height, int cols, int width)
{
    /* update the current row and set the current row layout */
    struct nk_window *win;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    nk_panel_layout(ctx, win, height, cols);
    if (fmt == NK_DYNAMIC)
        win->layout->row.type = NK_LAYOUT_DYNAMIC_FIXED;
    else win->layout->row.type = NK_LAYOUT_STATIC_FIXED;

    win->layout->row.ratio = 0;
    win->layout->row.filled = 0;
    win->layout->row.item_offset = 0;
    win->layout->row.item_width = (float)width;
}